

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtcpsdesinfo.h
# Opt level: O0

void __thiscall jrtplib::RTCPSDESInfo::SDESPrivateItem::~SDESPrivateItem(SDESPrivateItem *this)

{
  uint8_t *buf;
  RTPMemoryManager *mgr;
  SDESPrivateItem *this_local;
  
  (this->super_SDESItem).super_RTPMemoryObject._vptr_RTPMemoryObject =
       (_func_int **)&PTR__SDESPrivateItem_001ad960;
  if (this->prefix != (uint8_t *)0x0) {
    buf = this->prefix;
    mgr = RTPMemoryObject::GetMemoryManager((RTPMemoryObject *)this);
    RTPDeleteByteArray(buf,mgr);
  }
  SDESItem::~SDESItem(&this->super_SDESItem);
  return;
}

Assistant:

~SDESPrivateItem()						
		{ 
			if (prefix) 
				RTPDeleteByteArray(prefix,GetMemoryManager());
		}